

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_set_zero(ggml_tensor *tensor)

{
  void *__s;
  _Bool _Var1;
  size_t sVar2;
  
  _Var1 = ggml_is_empty(tensor);
  if (!_Var1) {
    if (tensor->buffer == (ggml_backend_buffer *)0x0) {
      __s = tensor->data;
      if (__s == (void *)0x0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                   0x17b5,"GGML_ASSERT(%s) failed","tensor->data");
      }
      sVar2 = ggml_nbytes(tensor);
      memset(__s,0,sVar2);
    }
    else {
      sVar2 = ggml_nbytes(tensor);
      ggml_backend_tensor_memset(tensor,'\0',0,sVar2);
    }
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_zero(struct ggml_tensor * tensor) {
    if (ggml_is_empty(tensor)) {
        return tensor;
    }
    if (tensor->buffer) {
        ggml_backend_tensor_memset(tensor, 0, 0, ggml_nbytes(tensor));
    } else {
        GGML_ASSERT(tensor->data);
        memset(tensor->data, 0, ggml_nbytes(tensor));
    }
    return tensor;
}